

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator_icu.cpp
# Opt level: O3

int __thiscall QCollator::compare(QCollator *this,QStringView s1,QStringView s2)

{
  int iVar1;
  ulong uVar2;
  EVP_PKEY_CTX *ctx;
  QCollatorPrivate *this_00;
  
  uVar2 = s2.m_size;
  ctx = (EVP_PKEY_CTX *)s1.m_size;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    iVar1 = -(uint)(uVar2 != 0);
  }
  else {
    if (uVar2 != 0) {
      this_00 = this->d;
      if (this_00->dirty == true) {
        QCollatorPrivate::init(this_00,ctx);
        this_00 = this->d;
      }
      if (this_00->collator != (CollatorType)0x0) {
        iVar1 = ucol_strcoll_70(this_00->collator,s1.m_data,(ulong)ctx & 0xffffffff,s2.m_data,
                                uVar2 & 0xffffffff);
        return iVar1;
      }
      iVar1 = QtPrivate::compareStrings(s1,s2,this_00->caseSensitivity);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int QCollator::compare(QStringView s1, QStringView s2) const
{
    if (!s1.size())
        return s2.size() ? -1 : 0;
    if (!s2.size())
        return +1;

    d->ensureInitialized();

    if (d->collator) {
        // truncating sizes (QTBUG-105038)
        return ucol_strcoll(d->collator,
                            reinterpret_cast<const UChar *>(s1.data()), s1.size(),
                            reinterpret_cast<const UChar *>(s2.data()), s2.size());
    }

    return QtPrivate::compareStrings(s1, s2, d->caseSensitivity);
}